

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.hpp
# Opt level: O1

Value<char16_t> * __thiscall Qentem::Value<char16_t>::operator=(Value<char16_t> *this,char16_t *str)

{
  undefined8 uVar1;
  anon_union_16_5_5c8fea6c_for_Value<char16_t>_1 local_28;
  
  reset(this);
  String<char16_t>::String((String<char16_t> *)&local_28.array_,str);
  if (&local_28 != &this->field_0) {
    String<char16_t>::deallocate((String<char16_t> *)this);
    (this->field_0).array_.storage_ = local_28.array_.storage_;
    (this->field_0).array_.index_ = local_28.array_.index_;
    local_28.array_.storage_ = (Value<char16_t> *)0x0;
    local_28.array_.index_ = 0;
  }
  uVar1 = local_28.array_.storage_;
  if (local_28.array_.storage_ != (Value<char16_t> *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_28.number_);
  }
  operator_delete((void *)uVar1);
  this->type_ = String;
  return this;
}

Assistant:

Value &operator=(const Char_T *str) {
        reset();
        string_ = StringT{str};
        setTypeToString();

        return *this;
    }